

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

string * __thiscall
llvm::ErrorInfoBase::message_abi_cxx11_(string *__return_storage_ptr__,ErrorInfoBase *this)

{
  undefined1 local_68 [8];
  raw_string_ostream OS;
  string Msg;
  
  Msg._M_dataplus._M_p = (pointer)0x0;
  Msg._M_string_length._0_1_ = 0;
  OS.super_raw_ostream.OutBufCur._0_4_ = 1;
  OS.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
  OS.super_raw_ostream.OutBufStart = (char *)0x0;
  OS.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_68 = (undefined1  [8])&PTR__raw_string_ostream_010794b8;
  OS.super_raw_ostream._32_8_ = &OS.OS;
  OS.OS = (string *)&Msg._M_string_length;
  (*this->_vptr_ErrorInfoBase[2])(this);
  if ((_func_int **)OS.super_raw_ostream.OutBufEnd != OS.super_raw_ostream._vptr_raw_ostream) {
    raw_ostream::flush_nonempty((raw_ostream *)local_68);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)OS.super_raw_ostream._32_8_,
             *(long *)(OS.super_raw_ostream._32_8_ + 8) + *(long *)OS.super_raw_ostream._32_8_);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_68);
  if (OS.OS != (string *)&Msg._M_string_length) {
    operator_delete(OS.OS,CONCAT71(Msg._M_string_length._1_7_,(undefined1)Msg._M_string_length) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string message() const {
    std::string Msg;
    raw_string_ostream OS(Msg);
    log(OS);
    return OS.str();
  }